

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

Token * __thiscall
inja::Lexer::scan_body(Token *__return_storage_ptr__,Lexer *this,string_view close,Kind closeKind)

{
  string_view *this_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  const_reference pcVar5;
  size_t pos;
  ulong pos_00;
  basic_string_view<char,_std::char_traits<char>_> view;
  
  this_00 = &this->m_in;
  pos = this->m_tok_start;
  do {
    if ((this->m_in).size_ <= pos) {
      closeKind = Eof;
LAB_00185c38:
      make_token(__return_storage_ptr__,this,closeKind);
      return __return_storage_ptr__;
    }
    pbVar4 = (byte *)nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::data_at
                               (this_00,pos);
    bVar1 = *pbVar4;
    if ((0x20 < (ulong)bVar1) || ((0x100002200U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
      view = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                       (this_00,this->m_tok_start,0xffffffffffffffff);
      bVar2 = string_view::starts_with(view,close);
      if (bVar2) {
        this->m_state = Text;
        this->m_pos = close.size_ + this->m_tok_start;
        goto LAB_00185c38;
      }
      if (bVar1 != 10) {
        pos_00 = this->m_tok_start + 1;
        this->m_pos = pos_00;
        iVar3 = isalpha((int)(char)bVar1);
        if (iVar3 != 0) {
LAB_00185c83:
          scan_id(__return_storage_ptr__,this);
          return __return_storage_ptr__;
        }
        switch(bVar1) {
        case 0x21:
          if ((pos_00 < (this->m_in).size_) &&
             (pcVar5 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::data_at
                                 (this_00,pos_00), *pcVar5 == '=')) {
            this->m_pos = this->m_pos + 1;
            closeKind = NotEqual;
            goto LAB_00185c38;
          }
          break;
        case 0x22:
          scan_string(__return_storage_ptr__,this);
          return __return_storage_ptr__;
        case 0x23:
        case 0x24:
        case 0x25:
        case 0x26:
        case 0x27:
        case 0x2a:
        case 0x2b:
        case 0x2e:
        case 0x2f:
        case 0x3b:
          break;
        case 0x28:
          closeKind = LeftParen;
          goto LAB_00185c38;
        case 0x29:
          closeKind = RightParen;
          goto LAB_00185c38;
        case 0x2c:
          closeKind = Comma;
          goto LAB_00185c38;
        case 0x2d:
        case 0x30:
        case 0x31:
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x35:
        case 0x36:
        case 0x37:
        case 0x38:
        case 0x39:
          scan_number(__return_storage_ptr__,this);
          return __return_storage_ptr__;
        case 0x3a:
          closeKind = Colon;
          goto LAB_00185c38;
        case 0x3c:
          if ((pos_00 < (this->m_in).size_) &&
             (pcVar5 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::data_at
                                 (this_00,pos_00), *pcVar5 == '=')) {
            this->m_pos = this->m_pos + 1;
            closeKind = LessEqual;
          }
          else {
            closeKind = LessThan;
          }
          goto LAB_00185c38;
        case 0x3d:
          if ((pos_00 < (this->m_in).size_) &&
             (pcVar5 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::data_at
                                 (this_00,pos_00), *pcVar5 == '=')) {
            this->m_pos = this->m_pos + 1;
            closeKind = Equal;
            goto LAB_00185c38;
          }
          break;
        case 0x3e:
          if ((pos_00 < (this->m_in).size_) &&
             (pcVar5 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::data_at
                                 (this_00,pos_00), *pcVar5 == '=')) {
            this->m_pos = this->m_pos + 1;
            closeKind = GreaterEqual;
          }
          else {
            closeKind = GreaterThan;
          }
          goto LAB_00185c38;
        default:
          if (bVar1 == 0x5b) {
            closeKind = LeftBracket;
            goto LAB_00185c38;
          }
          if (bVar1 == 0x5d) {
            closeKind = RightBracket;
            goto LAB_00185c38;
          }
          if (bVar1 == 0x5f) goto LAB_00185c83;
          if (bVar1 == 0x7b) {
            closeKind = LeftBrace;
            goto LAB_00185c38;
          }
          if (bVar1 == 0x7d) {
            closeKind = RightBrace;
            goto LAB_00185c38;
          }
        }
        closeKind = Unknown;
        goto LAB_00185c38;
      }
    }
    pos = this->m_tok_start + 1;
    this->m_tok_start = pos;
  } while( true );
}

Assistant:

Token scan_body(nonstd::string_view close, Token::Kind closeKind) {
	again:
		// skip whitespace (except for \n as it might be a close)
		if (m_tok_start >= m_in.size()) return make_token(Token::Kind::Eof);
		char ch = m_in[m_tok_start];
		if (ch == ' ' || ch == '\t' || ch == '\r') {
			m_tok_start += 1;
			goto again;
		}

		// check for close
		if (inja::string_view::starts_with(m_in.substr(m_tok_start), close)) {
			m_state = State::Text;
			m_pos = m_tok_start + close.size();
			return make_token(closeKind);
		}

		// skip \n
		if (ch == '\n') {
			m_tok_start += 1;
			goto again;
		}

		m_pos = m_tok_start + 1;
		if (std::isalpha(ch)) return scan_id();
		switch (ch) {
			case ',':
				return make_token(Token::Kind::Comma);
			case ':':
				return make_token(Token::Kind::Colon);
			case '(':
				return make_token(Token::Kind::LeftParen);
			case ')':
				return make_token(Token::Kind::RightParen);
			case '[':
				return make_token(Token::Kind::LeftBracket);
			case ']':
				return make_token(Token::Kind::RightBracket);
			case '{':
				return make_token(Token::Kind::LeftBrace);
			case '}':
				return make_token(Token::Kind::RightBrace);
			case '>':
				if (m_pos < m_in.size() && m_in[m_pos] == '=') {
					m_pos += 1;
					return make_token(Token::Kind::GreaterEqual);
				}
				return make_token(Token::Kind::GreaterThan);
			case '<':
				if (m_pos < m_in.size() && m_in[m_pos] == '=') {
					m_pos += 1;
					return make_token(Token::Kind::LessEqual);
				}
				return make_token(Token::Kind::LessThan);
			case '=':
				if (m_pos < m_in.size() && m_in[m_pos] == '=') {
					m_pos += 1;
					return make_token(Token::Kind::Equal);
				}
				return make_token(Token::Kind::Unknown);
			case '!':
				if (m_pos < m_in.size() && m_in[m_pos] == '=') {
					m_pos += 1;
					return make_token(Token::Kind::NotEqual);
				}
				return make_token(Token::Kind::Unknown);
			case '\"':
				return scan_string();
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9':
			case '-':
				return scan_number();
			case '_':
				return scan_id();
			default:
				return make_token(Token::Kind::Unknown);
		}
	}